

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.h
# Opt level: O2

poly * __thiscall poly::operator+=(poly *this,poly *o)

{
  uint uVar1;
  pointer puVar2;
  const_reference pvVar3;
  reference pvVar4;
  pointer puVar5;
  size_t i;
  ulong __n;
  
  puVar5 = (this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((*(int *)&(o->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
        *(int *)&(o->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start ^ (int)puVar2 - (int)puVar5) & 0x1ffffffcU) == 0)
  {
    for (__n = 0; __n < (ulong)((long)puVar2 - (long)puVar5 >> 2); __n = __n + 1) {
      pvVar3 = std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&o->x,__n);
      uVar1 = *pvVar3;
      pvVar4 = std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->x,__n);
      *pvVar4 = *pvVar4 ^ uVar1;
      puVar5 = (this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    this->_degree = -1;
    return this;
  }
  __assert_fail("bits() == o.bits()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/uranix[P]factormod/poly.h"
                ,0x5f,"poly &poly::operator+=(const poly &)");
}

Assistant:

poly &operator+=(const poly &o) {
        assert(bits() == o.bits());
        for (size_t i = 0; i < x.size(); i++)
            x[i] ^= o.x[i];
        _degree = -1;
        return *this;
    }